

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O1

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  pointer pBVar1;
  pointer pBVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  int iVar8;
  pointer pMVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  bool bVar13;
  pointer pvVar14;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar15;
  int iVar16;
  byte bVar17;
  pointer pfVar18;
  ulong uVar19;
  BBoxRect *__args;
  ulong uVar20;
  Yolov3DetectionOutput *pYVar21;
  float *pfVar22;
  ulong uVar23;
  long lVar24;
  float *pfVar25;
  ulong uVar26;
  uint uVar27;
  float *pfVar28;
  long lVar29;
  float *pfVar30;
  float fVar31;
  float extraout_XMM0_Db;
  float fVar33;
  undefined1 auVar32 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM3 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> bbox_scores;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<float,_std::allocator<float>_> local_1e8;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_1c8;
  undefined1 local_1a8 [8];
  undefined8 uStack_1a0;
  float *local_198;
  Yolov3DetectionOutput *local_188;
  float local_17c;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_178;
  long local_160;
  vector<float,_std::allocator<float>_> local_158;
  uint local_140;
  float local_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  ulong local_128;
  float *local_120;
  float local_118;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_100;
  Option *local_f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_f0;
  long local_e8;
  pointer local_e0;
  long local_d8;
  long local_d0;
  void *local_c8;
  ulong local_c0;
  ulong local_b8;
  void *local_b0;
  int local_a8;
  undefined4 uStack_a4;
  float *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  undefined1 extraout_var [12];
  
  local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_100 = top_blobs;
  local_f8 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar26 = 0;
    local_188 = this;
    local_f0 = bottom_blobs;
    do {
      pvVar15 = local_f0;
      pYVar21 = local_188;
      local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                *)&local_1e8,(long)local_188->num_box);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize(&local_1c8,(long)pYVar21->num_box);
      pMVar9 = (pvVar15->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar16 = pMVar9[uVar26].c / pYVar21->num_box;
      if (iVar16 != pYVar21->num_class + 5) {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&local_1c8);
        std::
        vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                   *)&local_1e8);
        iVar16 = -1;
        goto LAB_001738e8;
      }
      local_128 = uVar26;
      if (0 < pYVar21->num_box) {
        local_e0 = pMVar9 + uVar26;
        local_a8 = pMVar9[uVar26].w;
        uVar27 = (&pMVar9[uVar26].w)[1];
        auVar37._0_4_ = (float)local_a8;
        auVar37._4_4_ = (float)(int)uVar27;
        auVar37._8_8_ = 0;
        pvVar10 = (pYVar21->anchors_scale).data;
        fVar31 = *(float *)((long)pvVar10 + uVar26 * 4);
        in_XMM3 = rcpps(in_XMM3,auVar37);
        local_88 = in_XMM3._0_4_;
        fStack_84 = in_XMM3._4_4_;
        fStack_80 = in_XMM3._8_4_;
        fStack_7c = in_XMM3._12_4_;
        local_88 = (1.0 - auVar37._0_4_ * local_88) * local_88 + local_88;
        fStack_84 = (1.0 - auVar37._4_4_ * fStack_84) * fStack_84 + fStack_84;
        fStack_80 = (0.0 - fStack_80 * 0.0) * fStack_80 + fStack_80;
        fStack_7c = (0.0 - fStack_7c * 0.0) * fStack_7c + fStack_7c;
        auVar36._0_4_ = -(uint)(0 < local_a8);
        auVar36._4_4_ = -(uint)(0 < local_a8);
        auVar36._8_4_ = -(uint)(0 < (int)uVar27);
        auVar36._12_4_ = -(uint)(0 < (int)uVar27);
        local_140 = movmskpd((int)pvVar10,auVar36);
        bVar17 = (byte)local_140;
        auVar35._0_4_ = (float)(int)(fVar31 * auVar37._0_4_);
        auVar35._4_4_ = (float)(int)(fVar31 * auVar37._4_4_);
        auVar35._8_4_ = (float)(int)(fVar31 * 0.0);
        auVar35._12_4_ = (float)(int)(fVar31 * 0.0);
        auVar37 = rcpps(auVar36,auVar35);
        local_98 = auVar37._0_4_;
        fStack_94 = auVar37._4_4_;
        fStack_90 = auVar37._8_4_;
        fStack_8c = auVar37._12_4_;
        local_98 = (1.0 - auVar35._0_4_ * local_98) * local_98 + local_98;
        fStack_94 = (1.0 - auVar35._4_4_ * fStack_94) * fStack_94 + fStack_94;
        fStack_90 = (0.0 - auVar35._8_4_ * fStack_90) * fStack_90 + fStack_90;
        fStack_8c = (0.0 - auVar35._12_4_ * fStack_8c) * fStack_8c + fStack_8c;
        local_e8 = (long)iVar16;
        local_c0 = (ulong)uVar27;
        uStack_a4 = 0;
        local_d8 = (long)pYVar21->num_box * uVar26 * 4;
        local_160 = 0;
        do {
          if (bVar17 >> 1 != 0) {
            lVar24 = local_160 * local_e8;
            uVar26 = local_e0->elemsize;
            local_c8 = (void *)((lVar24 + 5) * local_e0->cstep * uVar26 + (long)local_e0->data);
            uVar23 = (long)local_e0->h * (long)local_e0->w * uVar26 + 0xf & 0xfffffffffffffff0;
            sVar11 = local_e0->cstep;
            pvVar10 = local_e0->data;
            sVar12 = local_e0->elemsize;
            pfVar22 = (float *)((lVar24 + 4) * sVar11 * sVar12 + (long)pvVar10);
            local_120 = (float *)((lVar24 + 3) * sVar11 * sVar12 + (long)pvVar10);
            pfVar28 = (float *)((lVar24 + 2) * sVar11 * sVar12 + (long)pvVar10);
            pfVar30 = (float *)((lVar24 + 1) * sVar11 * sVar12 + (long)pvVar10);
            pfVar25 = (float *)(lVar24 * sVar11 * sVar12 + (long)pvVar10);
            uVar6 = *(undefined8 *)
                     ((long)(pYVar21->biases).data +
                     (long)((int)*(float *)((long)(pYVar21->mask).data + local_160 * 4 + local_d8) *
                           2) * 4);
            local_78 = (float)uVar6 * 0.5;
            fStack_74 = (float)((ulong)uVar6 >> 0x20) * 0.5;
            uStack_70 = 0;
            uStack_6c = 0;
            local_d0 = (long)local_e0->w * uVar26;
            uVar19 = 0;
            do {
              local_b8 = uVar19;
              if ((local_140 & 1) != 0) {
                local_b0 = (void *)(uVar19 * local_d0 + (long)local_c8);
                local_68 = ZEXT416((uint)(float)(int)uVar19);
                lVar24 = 0;
                do {
                  local_a0 = pfVar22;
                  local_138 = expf(-*pfVar22);
                  local_138 = local_138 + 1.0;
                  if ((long)pYVar21->num_class < 1) {
                    iVar16 = 0;
                    fVar31 = -3.4028235e+38;
                  }
                  else {
                    uVar19 = 0;
                    uVar20 = 0;
                    fVar33 = -3.4028235e+38;
                    do {
                      fVar31 = *(float *)((long)local_b0 +
                                         (uVar23 - uVar23 % uVar26) * uVar19 + lVar24 * 4);
                      if (fVar33 < fVar31) {
                        uVar20 = uVar19 & 0xffffffff;
                      }
                      iVar16 = (int)uVar20;
                      if (fVar31 <= fVar33) {
                        fVar31 = fVar33;
                      }
                      uVar19 = uVar19 + 1;
                      fVar33 = fVar31;
                    } while ((long)pYVar21->num_class != uVar19);
                  }
                  fVar31 = expf(-fVar31);
                  local_17c = 1.0 / ((fVar31 + 1.0) * local_138);
                  if (local_188->confidence_threshold <= local_17c) {
                    local_138 = (float)(int)lVar24;
                    fStack_134 = (float)local_68._0_4_;
                    fStack_130 = 0.0;
                    fStack_12c = (float)local_68._4_4_;
                    local_13c = *pfVar28;
                    local_118 = *local_120;
                    local_58 = -*pfVar25;
                    fStack_54 = -*pfVar30;
                    uStack_50 = 0x80000000;
                    uStack_4c = 0x80000000;
                    local_48 = expf(local_58);
                    fStack_44 = extraout_XMM0_Db;
                    auVar32._0_4_ = expf(fStack_54);
                    auVar32._4_12_ = extraout_var;
                    auVar38._0_4_ = local_48 + 1.0;
                    auVar38._4_4_ = auVar32._0_4_ + 1.0;
                    auVar38._8_4_ = fStack_44 + 0.0;
                    auVar38._12_4_ = extraout_var._0_4_ + 0.0;
                    auVar37 = rcpps(auVar32,auVar38);
                    fVar31 = auVar37._0_4_;
                    fVar33 = auVar37._4_4_;
                    fVar40 = auVar37._8_4_;
                    fVar34 = auVar37._12_4_;
                    local_138 = (local_138 + fVar31 + (1.0 - auVar38._0_4_ * fVar31) * fVar31) *
                                local_88;
                    fStack_134 = (fStack_134 + fVar33 + (1.0 - auVar38._4_4_ * fVar33) * fVar33) *
                                 fStack_84;
                    fStack_130 = (fStack_130 + fVar40 + (0.0 - auVar38._8_4_ * fVar40) * fVar40) *
                                 fStack_80;
                    fStack_12c = (fStack_12c + fVar34 + (0.0 - auVar38._12_4_ * fVar34) * fVar34) *
                                 fStack_7c;
                    local_118 = expf(local_118);
                    fVar31 = expf(local_13c);
                    lVar29 = local_160;
                    fVar31 = fVar31 * local_78 * local_98;
                    fVar33 = local_118 * fStack_74 * fStack_94;
                    local_1a8._0_4_ = local_138 - fVar31;
                    local_1a8._4_4_ = fStack_134 - fVar33;
                    uStack_1a0 = (float *)CONCAT44(fVar33 + fStack_134,fVar31 + local_138);
                    local_198 = (float *)CONCAT44(local_198._4_4_,iVar16);
                    this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                              (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + local_160 * 6);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                      _M_realloc_insert<ncnn::BBoxRect_const&>
                                (this_00,__position,(BBoxRect *)local_1a8);
                    }
                    else {
                      (__position._M_current)->label = iVar16;
                      (__position._M_current)->xmin = (float)local_1a8._0_4_;
                      (__position._M_current)->ymin = (float)local_1a8._4_4_;
                      *(float **)&(__position._M_current)->xmax = uStack_1a0;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
                    }
                    this_01 = (vector<float,std::allocator<float>> *)
                              (local_1c8.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar29);
                    __position_00._M_current = *(float **)(this_01 + 8);
                    if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
                      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                (this_01,__position_00,&local_17c);
                    }
                    else {
                      *__position_00._M_current = local_17c;
                      *(float **)(this_01 + 8) = __position_00._M_current + 1;
                    }
                  }
                  pfVar25 = pfVar25 + 1;
                  pfVar30 = pfVar30 + 1;
                  pfVar28 = pfVar28 + 1;
                  local_120 = local_120 + 1;
                  pfVar22 = local_a0 + 1;
                  lVar24 = lVar24 + 1;
                  pYVar21 = local_188;
                } while (lVar24 != CONCAT44(uStack_a4,local_a8));
              }
              uVar19 = local_b8 + 1;
            } while (uVar19 != local_c0);
          }
          local_160 = local_160 + 1;
        } while (local_160 < pYVar21->num_box);
      }
      if (0 < pYVar21->num_box) {
        lVar24 = 8;
        lVar29 = 0;
        do {
          pvVar14 = local_1c8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                    ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_178,
                     local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar24 + -8),
                     *(undefined8 *)
                      ((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar24));
          std::vector<float,std::allocator<float>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                    ((vector<float,std::allocator<float>> *)&local_158,
                     local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,*(undefined8 *)((long)pvVar14 + lVar24 + -8),
                     *(undefined8 *)
                      ((long)&(pvVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar24));
          lVar29 = lVar29 + 1;
          lVar24 = lVar24 + 0x18;
        } while (lVar29 < local_188->num_box);
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_1c8);
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                 *)&local_1e8);
      uVar26 = local_128 + 1;
      this = local_188;
    } while (uVar26 < (ulong)((long)(local_f0->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_f0->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_start >> 6));
  }
  if ((local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    qsort_descent_inplace<ncnn::BBoxRect>
              (&local_178,&local_158,0,
               (int)((ulong)((long)local_158.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_158.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
  }
  pBVar2 = local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar1 = local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1c8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188 = (Yolov3DetectionOutput *)CONCAT44(local_188._4_4_,this->nms_threshold);
  uVar26 = ((long)local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  std::vector<float,_std::allocator<float>_>::vector(&local_1e8,uVar26,(allocator_type *)local_1a8);
  if (pBVar2 == pBVar1) {
    local_1a8 = (undefined1  [8])0x0;
  }
  else {
    pfVar22 = &(local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start)->xmax;
    lVar24 = 0;
    do {
      uVar5 = ((BBoxRect *)(pfVar22 + -2))->xmin;
      uVar7 = ((BBoxRect *)(pfVar22 + -2))->ymin;
      local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar24] =
           ((float)((ulong)*(undefined8 *)pfVar22 >> 0x20) - (float)uVar7) *
           ((float)*(undefined8 *)pfVar22 - (float)uVar5);
      lVar24 = lVar24 + 1;
      pfVar22 = pfVar22 + 5;
    } while (uVar26 + (uVar26 == 0) != lVar24);
    local_1a8 = (undefined1  [8])0x0;
    if (pBVar2 != pBVar1) {
      do {
        uVar27 = (uint)((ulong)((long)local_1c8.
                                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1c8.
                                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if ((int)uVar27 < 1) {
LAB_00173670:
          if (local_1c8.
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_1c8.
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1c8,
                       (iterator)
                       local_1c8.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_1a8);
          }
          else {
            *(undefined1 (*) [8])
             local_1c8.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_1a8;
            local_1c8.
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((long)local_1c8.
                                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 8);
          }
        }
        else {
          pBVar1 = local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                   _M_impl.super__Vector_impl_data._M_start + (long)local_1a8;
          fVar31 = pBVar1->xmin;
          bVar13 = true;
          uVar19 = 0;
          do {
            pfVar18 = (&((local_1c8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start)[uVar19];
            fVar33 = local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)pfVar18].xmax;
            fVar40 = 0.0;
            if (fVar31 <= fVar33) {
              pBVar2 = local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)pfVar18;
              fVar34 = pBVar1->xmax;
              fVar41 = pBVar2->xmin;
              if (fVar41 <= fVar34) {
                fVar3 = pBVar1->ymin;
                fVar39 = pBVar2->ymax;
                if (fVar3 <= fVar39) {
                  fVar4 = pBVar1->ymax;
                  fVar42 = pBVar2->ymin;
                  if (fVar42 <= fVar4) {
                    if (fVar34 <= fVar33) {
                      fVar33 = fVar34;
                    }
                    if (fVar41 <= fVar31) {
                      fVar41 = fVar31;
                    }
                    if (fVar4 <= fVar39) {
                      fVar39 = fVar4;
                    }
                    if (fVar42 <= fVar3) {
                      fVar42 = fVar3;
                    }
                    fVar40 = (fVar39 - fVar42) * (fVar33 - fVar41);
                  }
                }
              }
            }
            if (local_188._0_4_ <
                fVar40 / ((local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)local_1a8] - fVar40) +
                         local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)pfVar18])) {
              bVar13 = false;
            }
            uVar19 = uVar19 + 1;
          } while ((uVar27 & 0x7fffffff) != uVar19);
          if (bVar13) goto LAB_00173670;
        }
        local_1a8 = (undefined1  [8])((long)local_1a8 + 1);
      } while ((ulong)local_1a8 < uVar26);
    }
  }
  if (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar16 = 0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_198 = (float *)0x0;
  local_1a8 = (undefined1  [8])0x0;
  uStack_1a0 = (float *)0x0;
  if (local_1c8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1c8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar26 = 0;
    do {
      pfVar18 = (&((local_1c8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
                  ._M_start)[uVar26];
      __args = local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
               .super__Vector_impl_data._M_start + (long)pfVar18;
      if (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
        _M_realloc_insert<ncnn::BBoxRect_const&>
                  ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1e8,
                   (iterator)
                   local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        *(int *)((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 0x10) = __args->label;
        fVar31 = __args->ymin;
        uVar6 = *(undefined8 *)&__args->xmax;
        local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish[0] = __args->xmin;
        local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish[1] = fVar31;
        *(undefined8 *)
         ((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) = uVar6;
        local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 0x14);
      }
      if (uStack_1a0 == local_198) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)local_1a8,uStack_1a0,
                   local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)pfVar18);
      }
      else {
        *uStack_1a0 = local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pfVar18];
        uStack_1a0 = uStack_1a0 + 1;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < (ulong)((long)local_1c8.
                                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1c8.
                                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  uVar27 = (int)((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) * -0x33333333;
  if (uVar27 != 0) {
    this_02 = (local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_02,6,uVar27,4,local_f8->blob_allocator);
    iVar16 = -100;
    if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
       (iVar16 = 0, 0 < (int)uVar27)) {
      iVar8 = this_02->w;
      sVar11 = this_02->elemsize;
      pfVar22 = (float *)((long)this_02->data + 0x14);
      pfVar18 = local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + 4;
      iVar16 = 0;
      uVar26 = 0;
      do {
        fVar31 = *(float *)((long)local_1a8 + uVar26 * 4);
        pfVar22[-5] = (float)((int)*pfVar18 + 1);
        pfVar22[-4] = fVar31;
        pfVar22[-3] = pfVar18[-4];
        pfVar22[-2] = pfVar18[-3];
        pfVar22[-1] = pfVar18[-2];
        *pfVar22 = pfVar18[-1];
        uVar26 = uVar26 + 1;
        pfVar22 = (float *)((long)pfVar22 + (long)iVar8 * sVar11);
        pfVar18 = pfVar18 + 5;
      } while ((uVar27 & 0x7fffffff) != uVar26);
    }
  }
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,(long)local_198 - (long)local_1a8);
  }
  if (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_001738e8:
  if (local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar16;
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector< std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector< std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
#pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {


                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -std::numeric_limits<float>::max();
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
                    class_score = sigmoid(class_score);

                    //printf( "%d %f %f\n", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                                            // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;
                        
                        BBoxRect c = { bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index };
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }



        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }

    }
    

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1);// +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}